

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr_quadratic.h
# Opt level: O0

longdouble * __thiscall
mp::QuadAndLinTerms::ComputeValue<std::vector<double,std::allocator<double>>>
          (QuadAndLinTerms *this,vector<double,_std::allocator<double>_> *x)

{
  longdouble *plVar1;
  vector<double,_std::allocator<double>_> *in_stack_00000038;
  QuadTerms *in_stack_00000040;
  vector<double,_std::allocator<double>_> *in_stack_000000a8;
  LinTerms *in_stack_000000b0;
  
  LinTerms::ComputeValue<std::vector<double,std::allocator<double>>>
            (in_stack_000000b0,in_stack_000000a8);
  plVar1 = QuadTerms::ComputeValue<std::vector<double,std::allocator<double>>>
                     (in_stack_00000040,in_stack_00000038);
  return plVar1;
}

Assistant:

long double ComputeValue(const VarInfo& x) const {
    return LinTerms::ComputeValue(x) + QuadTerms::ComputeValue(x);
  }